

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::Print
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,ostream *out)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,
             "virtual void TPZCompElHDiv<pzshape::TPZShapePrism>::Print(std::ostream &) const [TSHAPE = pzshape::TPZShapePrism]"
             ,0x71);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  TPZInterpolatedElement::Print((TPZInterpolatedElement *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Side orientation ",0x11);
  poVar1 = ::operator<<(out,&(this->fSideOrient).super_TPZVec<int>);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((this->fRestraints).
      super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl._M_node.
      _M_size != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"One shape restraints associated with the element\n",0x31);
    for (p_Var2 = (this->fRestraints).
                  super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
                  _M_impl._M_node.super__List_node_base._M_next;
        p_Var2 != (_List_node_base *)&this->fRestraints; p_Var2 = p_Var2->_M_next) {
      TPZOneShapeRestraint::Print((TPZOneShapeRestraint *)(p_Var2 + 1),out);
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Print(std::ostream &out) const
{
    out << __PRETTY_FUNCTION__ << std::endl;
    TPZIntelGen<TSHAPE>::Print(out);
    out << "Side orientation " << fSideOrient << std::endl;
    if (fRestraints.size()) {
        out << "One shape restraints associated with the element\n";
        for (std::list<TPZOneShapeRestraint>::const_iterator it = fRestraints.begin(); it != fRestraints.end(); it++)
        {
            it->Print(out);
        }
    }



}